

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModelValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)555>(Result *__return_storage_ptr__,Model *format)

{
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  interface_00;
  bool bVar1;
  int32 modelVersion;
  ValueCase VVar2;
  ulong uVar3;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_148;
  value_type *param;
  const_iterator __end1;
  const_iterator __begin1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *__range1;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
  *parameters;
  string local_d8;
  CustomModel *customModel;
  undefined1 local_a8 [48];
  Result result;
  allocator local_41;
  string local_40;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_40._M_storage._M_storage = (uchar  [8])Specification::Model::description(format);
  bVar1 = Specification::Model::has_custommodel((Model *)interface);
  if (bVar1) {
    Result::Result((Result *)(local_a8 + 0x28));
    interface_00._M_storage = local_40._M_storage._M_storage;
    modelVersion = Specification::Model::specificationversion((Model *)interface);
    validateModelDescription
              ((Result *)local_a8,(ModelDescription *)interface_00._M_storage,modelVersion);
    Result::operator=((Result *)(local_a8 + 0x28),(Result *)local_a8);
    Result::~Result((Result *)local_a8);
    bVar1 = Result::good((Result *)(local_a8 + 0x28));
    if (bVar1) {
      local_d8._M_storage._M_storage =
           (uchar  [8])Specification::Model::custommodel((Model *)interface);
      Specification::CustomModel::classname_abi_cxx11_
                ((CustomModel *)local_d8._M_storage._M_storage);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        this = Specification::CustomModel::parameters_abi_cxx11_
                         ((CustomModel *)local_d8._M_storage._M_storage);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::begin((const_iterator *)&__end1.it_.bucket_index_,this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
        ::end((const_iterator *)&param,this);
        while( true ) {
          bVar1 = google::protobuf::operator!=
                            ((const_iterator *)&__end1.it_.bucket_index_,(const_iterator *)&param);
          if (!bVar1) break;
          local_148._M_storage._M_storage =
               (uchar  [8])
               google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
               ::const_iterator::operator*((const_iterator *)&__end1.it_.bucket_index_);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_148,
                       "CustomModel.parameters must have non-empty string keys.",
                       (allocator *)(local_170._M_storage._M_storage + 7));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(local_170._M_storage._M_storage + 7));
            goto LAB_0036269e;
          }
          VVar2 = Specification::CustomModel_CustomModelParamValue::value_case
                            ((CustomModel_CustomModelParamValue *)
                             ((long)local_148._M_storage._M_storage + 0x20));
          if (VVar2 == VALUE_NOT_SET) {
            std::operator+(&local_190,"CustomModel.parameters[\'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_148._M_storage._M_storage);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_170,&local_190,"\'] does not have a set value");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            goto LAB_0036269e;
          }
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
          ::const_iterator::operator++((const_iterator *)&__end1.it_.bucket_index_);
        }
        Result::Result(__return_storage_ptr__,(Result *)(local_a8 + 0x28));
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_d8,"CustomModel must have non-empty className.",
                   (allocator *)((long)&parameters + 7));
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&parameters + 7));
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)(local_a8 + 0x28));
    }
LAB_0036269e:
    customModel._4_4_ = 1;
    Result::~Result((Result *)(local_a8 + 0x28));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Model not an a CustomModel.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_customModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if(!format.has_custommodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a CustomModel.");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        const auto& customModel = format.custommodel();

        if (customModel.classname().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "CustomModel must have non-empty className.");
        }

        const auto& parameters = customModel.parameters();
        for(const auto& param : parameters) {
            if (param.first.empty()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "CustomModel.parameters must have non-empty string keys.");
            }

            switch (param.second.value_case()) {
                case Specification::CustomModel_CustomModelParamValue::VALUE_NOT_SET:
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "CustomModel.parameters['"+param.first+"'] does not have a set value");
                default:
                    break;
            }
        }

        return result;
    }